

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O0

bool test3(void)

{
  int local_48;
  int j_1;
  int local_34;
  undefined1 local_30 [4];
  int j;
  Stack s;
  int i;
  int nData;
  int nRun;
  
  for (s.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      s.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 0x14;
      s.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           s.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    CP::stack<int>::stack((stack<int> *)local_30);
    for (local_34 = 0; local_34 < 1000000; local_34 = local_34 + 1) {
      CP::stack<int>::push((stack<int> *)local_30,&local_34);
    }
    for (local_48 = 0; local_48 < 1000000; local_48 = local_48 + 1) {
      CP::stack<int>::pop((stack<int> *)local_30);
    }
    CP::stack<int>::~stack((stack<int> *)local_30);
  }
  return true;
}

Assistant:

bool test3() {
  int nRun = 20;
  int nData = 1000000;
  for (int i = 0;i < nRun;i++) {
    Stack s;
    for (int j = 0;j < nData;j++) {
      s.push(j);
    }
    for (int j = 0;j < nData;j++) {
      s.pop();
    }
  }
  return true;
}